

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_ssse3.c
# Opt level: O3

void av1_highbd_convolve_x_sr_ssse3
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params,
               int bd)

{
  uint16_t uVar1;
  undefined1 (*pauVar5) [32];
  undefined4 *puVar6;
  int16_t *piVar7;
  undefined8 uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined1 auVar23 [16];
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  undefined1 (*pauVar27) [16];
  uint uVar28;
  uint16_t *puVar29;
  ulong uVar30;
  undefined1 (*pauVar31) [16];
  int iVar32;
  undefined1 auVar33 [16];
  int iVar34;
  short sVar35;
  undefined4 uVar36;
  short sVar41;
  short sVar42;
  undefined4 uVar43;
  short sVar44;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  short sVar52;
  short sVar54;
  short sVar55;
  short sVar56;
  undefined1 auVar53 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  ushort uVar59;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  ushort uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  short local_98;
  short sStack_96;
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  
  uVar59 = filter_params_x->taps;
  uVar28 = 7 - conv_params->round_0;
  uVar24 = 0xff;
  if (bd == 0xc) {
    uVar24 = 0xfff;
  }
  uVar25 = 0x3ff;
  if (bd != 10) {
    uVar25 = uVar24;
  }
  auVar33 = ZEXT416((uint)conv_params->round_0);
  auVar50 = ZEXT416(uVar28);
  iVar32 = (1 << ((byte)conv_params->round_0 & 0x1f)) >> 1;
  iVar34 = (1 << ((byte)uVar28 & 0x1f)) >> 1;
  auVar37 = pshuflw(ZEXT416(uVar25),ZEXT416(uVar25),0);
  local_98 = auVar37._0_2_;
  sStack_96 = auVar37._2_2_;
  if (uVar59 == 0xc) {
    if (0 < w) {
      uVar26 = (ulong)((subpel_x_qn & 0xfU) * 0x18);
      uVar8 = *(undefined8 *)((long)filter_params_x->filter_ptr + uVar26 + 0x10);
      puVar6 = (undefined4 *)((long)filter_params_x->filter_ptr + uVar26);
      uVar19 = *puVar6;
      uVar20 = puVar6[1];
      uVar21 = puVar6[2];
      uVar22 = puVar6[3];
      uVar36 = (undefined4)uVar8;
      uVar43 = (undefined4)((ulong)uVar8 >> 0x20);
      pauVar27 = (undefined1 (*) [16])(src + (0x11 - (ulong)(uint)(uVar59 >> 1)));
      uVar26 = 0;
      auVar39._4_4_ = uVar21;
      auVar39._0_4_ = uVar21;
      auVar39._8_4_ = uVar21;
      auVar39._12_4_ = uVar21;
      auVar40._4_4_ = uVar36;
      auVar40._0_4_ = uVar36;
      auVar40._8_4_ = uVar36;
      auVar40._12_4_ = uVar36;
      auVar51._4_4_ = uVar19;
      auVar51._0_4_ = uVar19;
      auVar51._8_4_ = uVar19;
      auVar51._12_4_ = uVar19;
      do {
        puVar29 = dst;
        uVar30 = (ulong)(uint)h;
        pauVar31 = pauVar27;
        if (0 < h) {
          do {
            pauVar5 = (undefined1 (*) [32])(pauVar31 + -2);
            auVar37 = pauVar31[-1];
            auVar47 = *pauVar31;
            auVar9._16_16_ = auVar47;
            auVar9._0_16_ = auVar37;
            auVar45 = pmaddwd(SUB3216(*pauVar5,8),auVar39);
            auVar53._4_4_ = uVar22;
            auVar53._0_4_ = uVar22;
            auVar53._8_4_ = uVar22;
            auVar53._12_4_ = uVar22;
            auVar38 = pmaddwd(SUB3216(*pauVar5,0xc),auVar53);
            auVar46 = pmaddwd(auVar37,auVar40);
            auVar49._4_4_ = uVar43;
            auVar49._0_4_ = uVar43;
            auVar49._8_4_ = uVar43;
            auVar49._12_4_ = uVar43;
            auVar57 = pmaddwd(auVar9._4_16_,auVar49);
            auVar10._16_16_ = auVar47;
            auVar10._0_16_ = auVar37;
            auVar11._16_16_ = auVar47;
            auVar11._0_16_ = auVar37;
            auVar60 = pmaddwd(*(undefined1 (*) [16])*pauVar5,auVar51);
            auVar23._4_4_ = uVar20;
            auVar23._0_4_ = uVar20;
            auVar23._8_4_ = uVar20;
            auVar23._12_4_ = uVar20;
            auVar69 = pmaddwd(SUB3216(*pauVar5,4),auVar23);
            auVar48 = pmaddwd(SUB3216(*pauVar5,6),auVar23);
            auVar37 = pmaddwd(SUB3216(*pauVar5,10),auVar39);
            auVar70._4_4_ = uVar22;
            auVar70._0_4_ = uVar22;
            auVar70._8_4_ = uVar22;
            auVar70._12_4_ = uVar22;
            auVar49 = pmaddwd(SUB3216(*pauVar5,0xe),auVar70);
            auVar53 = pmaddwd(auVar10._2_16_,auVar40);
            auVar58._4_4_ = uVar43;
            auVar58._0_4_ = uVar43;
            auVar58._8_4_ = uVar43;
            auVar58._12_4_ = uVar43;
            auVar47 = pmaddwd(auVar11._6_16_,auVar58);
            auVar58 = pmaddwd(SUB3216(*pauVar5,2),auVar51);
            auVar61._0_4_ =
                 (auVar60._0_4_ + iVar32 + auVar69._0_4_ + auVar38._0_4_ + auVar45._0_4_ +
                  auVar57._0_4_ + auVar46._0_4_ >> auVar33) + iVar34 >> auVar50;
            auVar61._4_4_ =
                 (auVar60._4_4_ + iVar32 + auVar69._4_4_ + auVar38._4_4_ + auVar45._4_4_ +
                  auVar57._4_4_ + auVar46._4_4_ >> auVar33) + iVar34 >> auVar50;
            auVar61._8_4_ =
                 (auVar60._8_4_ + iVar32 + auVar69._8_4_ + auVar38._8_4_ + auVar45._8_4_ +
                  auVar57._8_4_ + auVar46._8_4_ >> auVar33) + iVar34 >> auVar50;
            auVar61._12_4_ =
                 (auVar60._12_4_ + iVar32 + auVar69._12_4_ + auVar38._12_4_ + auVar45._12_4_ +
                  auVar57._12_4_ + auVar46._12_4_ >> auVar33) + iVar34 >> auVar50;
            auVar38 = packssdw(auVar61,auVar61);
            auVar57._0_4_ =
                 (auVar58._0_4_ + iVar32 + auVar37._0_4_ + auVar48._0_4_ +
                  auVar47._0_4_ + auVar53._0_4_ + auVar49._0_4_ >> auVar33) + iVar34 >> auVar50;
            auVar57._4_4_ =
                 (auVar58._4_4_ + iVar32 + auVar37._4_4_ + auVar48._4_4_ +
                  auVar47._4_4_ + auVar53._4_4_ + auVar49._4_4_ >> auVar33) + iVar34 >> auVar50;
            auVar57._8_4_ =
                 (auVar58._8_4_ + iVar32 + auVar37._8_4_ + auVar48._8_4_ +
                  auVar47._8_4_ + auVar53._8_4_ + auVar49._8_4_ >> auVar33) + iVar34 >> auVar50;
            auVar57._12_4_ =
                 (auVar58._12_4_ + iVar32 + auVar37._12_4_ + auVar48._12_4_ +
                  auVar47._12_4_ + auVar53._12_4_ + auVar49._12_4_ >> auVar33) + iVar34 >> auVar50;
            auVar37 = packssdw(auVar57,auVar57);
            sVar44 = auVar37._6_2_;
            sVar56 = auVar38._6_2_;
            sVar42 = auVar37._4_2_;
            sVar55 = auVar38._4_2_;
            sVar41 = auVar37._2_2_;
            sVar54 = auVar38._2_2_;
            sVar35 = auVar37._0_2_;
            sVar52 = auVar38._0_2_;
            uVar59 = (ushort)(local_98 < sVar52) * local_98 | (ushort)(local_98 >= sVar52) * sVar52;
            uVar62 = (ushort)(sStack_96 < sVar35) * sStack_96 |
                     (ushort)(sStack_96 >= sVar35) * sVar35;
            uVar63 = (ushort)(local_98 < sVar54) * local_98 | (ushort)(local_98 >= sVar54) * sVar54;
            uVar64 = (ushort)(sStack_96 < sVar41) * sStack_96 |
                     (ushort)(sStack_96 >= sVar41) * sVar41;
            uVar65 = (ushort)(local_98 < sVar55) * local_98 | (ushort)(local_98 >= sVar55) * sVar55;
            uVar66 = (ushort)(sStack_96 < sVar42) * sStack_96 |
                     (ushort)(sStack_96 >= sVar42) * sVar42;
            uVar67 = (ushort)(local_98 < sVar56) * local_98 | (ushort)(local_98 >= sVar56) * sVar56;
            uVar68 = (ushort)(sStack_96 < sVar44) * sStack_96 |
                     (ushort)(sStack_96 >= sVar44) * sVar44;
            uVar1 = (-1 < (short)uVar59) * uVar59;
            uVar2 = (-1 < (short)uVar62) * uVar62;
            uVar3 = (-1 < (short)uVar63) * uVar63;
            uVar4 = (-1 < (short)uVar64) * uVar64;
            if ((long)uVar26 < (long)((ulong)(uint)w - 4)) {
              *puVar29 = uVar1;
              puVar29[1] = uVar2;
              puVar29[2] = uVar3;
              puVar29[3] = uVar4;
              puVar29[4] = (-1 < (short)uVar65) * uVar65;
              puVar29[5] = (-1 < (short)uVar66) * uVar66;
              puVar29[6] = (-1 < (short)uVar67) * uVar67;
              puVar29[7] = (-1 < (short)uVar68) * uVar68;
            }
            else if (w == 4) {
              *puVar29 = uVar1;
              puVar29[1] = uVar2;
              puVar29[2] = uVar3;
              puVar29[3] = uVar4;
            }
            else {
              *puVar29 = uVar1;
              puVar29[1] = uVar2;
            }
            uVar30 = uVar30 - 1;
            puVar29 = puVar29 + dst_stride;
            pauVar31 = (undefined1 (*) [16])(*pauVar31 + (long)src_stride * 2);
          } while (uVar30 != 0);
        }
        uVar26 = uVar26 + 8;
        dst = dst + 8;
        pauVar27 = pauVar27 + 1;
      } while (uVar26 < (uint)w);
    }
  }
  else if (0 < w) {
    piVar7 = filter_params_x->filter_ptr + (subpel_x_qn & 0xfU) * (uint)uVar59;
    uVar19 = *(undefined4 *)piVar7;
    uVar20 = *(undefined4 *)(piVar7 + 2);
    uVar21 = *(undefined4 *)(piVar7 + 4);
    uVar22 = *(undefined4 *)(piVar7 + 6);
    auVar37._4_4_ = uVar19;
    auVar37._0_4_ = uVar19;
    auVar37._8_4_ = uVar19;
    auVar37._12_4_ = uVar19;
    auVar47._4_4_ = uVar20;
    auVar47._0_4_ = uVar20;
    auVar47._8_4_ = uVar20;
    auVar47._12_4_ = uVar20;
    auVar38._4_4_ = uVar21;
    auVar38._0_4_ = uVar21;
    auVar38._8_4_ = uVar21;
    auVar38._12_4_ = uVar21;
    auVar45._4_4_ = uVar22;
    auVar45._0_4_ = uVar22;
    auVar45._8_4_ = uVar22;
    auVar45._12_4_ = uVar22;
    pauVar27 = (undefined1 (*) [16])((long)src + (0x12 - (ulong)((uint)(uVar59 >> 1) * 2)));
    uVar26 = 0;
    do {
      puVar29 = dst;
      uVar30 = (ulong)(uint)h;
      pauVar31 = pauVar27;
      if (0 < h) {
        do {
          auVar40 = pauVar31[-1];
          auVar46 = *pauVar31;
          auVar12._16_16_ = auVar46;
          auVar12._0_16_ = auVar40;
          auVar13._16_16_ = auVar46;
          auVar13._0_16_ = auVar40;
          auVar14._16_16_ = auVar46;
          auVar14._0_16_ = auVar40;
          auVar39 = pmaddwd(auVar13._8_16_,auVar38);
          auVar58 = pmaddwd(auVar14._12_16_,auVar45);
          auVar15._16_16_ = auVar46;
          auVar15._0_16_ = auVar40;
          auVar16._16_16_ = auVar46;
          auVar16._0_16_ = auVar40;
          auVar17._16_16_ = auVar46;
          auVar17._0_16_ = auVar40;
          auVar18._16_16_ = auVar46;
          auVar18._0_16_ = auVar40;
          auVar46 = pmaddwd(auVar40,auVar37);
          auVar49 = pmaddwd(auVar12._4_16_,auVar47);
          auVar40 = pmaddwd(auVar15._2_16_,auVar37);
          auVar53 = pmaddwd(auVar16._6_16_,auVar47);
          auVar70 = pmaddwd(auVar17._10_16_,auVar38);
          auVar51 = pmaddwd(auVar18._14_16_,auVar45);
          auVar48._0_4_ =
               (auVar46._0_4_ + iVar32 + auVar49._0_4_ + auVar58._0_4_ + auVar39._0_4_ >> auVar33) +
               iVar34 >> auVar50;
          auVar48._4_4_ =
               (auVar46._4_4_ + iVar32 + auVar49._4_4_ + auVar58._4_4_ + auVar39._4_4_ >> auVar33) +
               iVar34 >> auVar50;
          auVar48._8_4_ =
               (auVar46._8_4_ + iVar32 + auVar49._8_4_ + auVar58._8_4_ + auVar39._8_4_ >> auVar33) +
               iVar34 >> auVar50;
          auVar48._12_4_ =
               (auVar46._12_4_ + iVar32 + auVar49._12_4_ + auVar58._12_4_ + auVar39._12_4_ >>
               auVar33) + iVar34 >> auVar50;
          auVar39 = packssdw(auVar48,auVar48);
          auVar46._0_4_ =
               (auVar40._0_4_ + iVar32 + auVar70._0_4_ + auVar53._0_4_ + auVar51._0_4_ >> auVar33) +
               iVar34 >> auVar50;
          auVar46._4_4_ =
               (auVar40._4_4_ + iVar32 + auVar70._4_4_ + auVar53._4_4_ + auVar51._4_4_ >> auVar33) +
               iVar34 >> auVar50;
          auVar46._8_4_ =
               (auVar40._8_4_ + iVar32 + auVar70._8_4_ + auVar53._8_4_ + auVar51._8_4_ >> auVar33) +
               iVar34 >> auVar50;
          auVar46._12_4_ =
               (auVar40._12_4_ + iVar32 + auVar70._12_4_ + auVar53._12_4_ + auVar51._12_4_ >>
               auVar33) + iVar34 >> auVar50;
          auVar40 = packssdw(auVar46,auVar46);
          sVar44 = auVar40._6_2_;
          sVar56 = auVar39._6_2_;
          sVar42 = auVar40._4_2_;
          sVar55 = auVar39._4_2_;
          sVar41 = auVar40._2_2_;
          sVar54 = auVar39._2_2_;
          sVar35 = auVar40._0_2_;
          sVar52 = auVar39._0_2_;
          uVar59 = (ushort)(local_98 < sVar52) * local_98 | (ushort)(local_98 >= sVar52) * sVar52;
          uVar62 = (ushort)(sStack_96 < sVar35) * sStack_96 | (ushort)(sStack_96 >= sVar35) * sVar35
          ;
          uVar63 = (ushort)(local_98 < sVar54) * local_98 | (ushort)(local_98 >= sVar54) * sVar54;
          uVar64 = (ushort)(sStack_96 < sVar41) * sStack_96 | (ushort)(sStack_96 >= sVar41) * sVar41
          ;
          uVar65 = (ushort)(local_98 < sVar55) * local_98 | (ushort)(local_98 >= sVar55) * sVar55;
          uVar66 = (ushort)(sStack_96 < sVar42) * sStack_96 | (ushort)(sStack_96 >= sVar42) * sVar42
          ;
          uVar67 = (ushort)(local_98 < sVar56) * local_98 | (ushort)(local_98 >= sVar56) * sVar56;
          uVar68 = (ushort)(sStack_96 < sVar44) * sStack_96 | (ushort)(sStack_96 >= sVar44) * sVar44
          ;
          uVar1 = (-1 < (short)uVar59) * uVar59;
          uVar2 = (-1 < (short)uVar62) * uVar62;
          uVar3 = (-1 < (short)uVar63) * uVar63;
          uVar4 = (-1 < (short)uVar64) * uVar64;
          if ((long)uVar26 < (long)((ulong)(uint)w - 4)) {
            *puVar29 = uVar1;
            puVar29[1] = uVar2;
            puVar29[2] = uVar3;
            puVar29[3] = uVar4;
            puVar29[4] = (-1 < (short)uVar65) * uVar65;
            puVar29[5] = (-1 < (short)uVar66) * uVar66;
            puVar29[6] = (-1 < (short)uVar67) * uVar67;
            puVar29[7] = (-1 < (short)uVar68) * uVar68;
          }
          else if (w == 4) {
            *puVar29 = uVar1;
            puVar29[1] = uVar2;
            puVar29[2] = uVar3;
            puVar29[3] = uVar4;
          }
          else {
            *puVar29 = uVar1;
            puVar29[1] = uVar2;
          }
          uVar30 = uVar30 - 1;
          puVar29 = puVar29 + dst_stride;
          pauVar31 = (undefined1 (*) [16])(*pauVar31 + (long)src_stride * 2);
        } while (uVar30 != 0);
      }
      uVar26 = uVar26 + 8;
      dst = dst + 8;
      pauVar27 = pauVar27 + 1;
    } while (uVar26 < (uint)w);
  }
  return;
}

Assistant:

void av1_highbd_convolve_x_sr_ssse3(const uint16_t *src, int src_stride,
                                    uint16_t *dst, int dst_stride, int w, int h,
                                    const InterpFilterParams *filter_params_x,
                                    const int subpel_x_qn,
                                    ConvolveParams *conv_params, int bd) {
  int i, j;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_horiz;

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  const __m128i round_const_x =
      _mm_set1_epi32(((1 << conv_params->round_0) >> 1));
  const __m128i round_shift_x = _mm_cvtsi32_si128(conv_params->round_0);

  const int bits = FILTER_BITS - conv_params->round_0;

  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m128i round_const_bits = _mm_set1_epi32((1 << bits) >> 1);
  const __m128i clip_pixel =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m128i zero = _mm_setzero_si128();

  if (filter_params_x->taps == 12) {
    __m128i s[6], coeffs_x[6];

    prepare_coeffs_12tap(filter_params_x, subpel_x_qn, coeffs_x);

    for (j = 0; j < w; j += 8) {
      /* Horizontal filter */
      {
        for (i = 0; i < h; i += 1) {
          const __m128i row00 =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
          const __m128i row01 =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + (j + 8)]);
          const __m128i row02 =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + (j + 16)]);

          // even pixels
          s[0] = _mm_alignr_epi8(row01, row00, 0);
          s[1] = _mm_alignr_epi8(row01, row00, 4);
          s[2] = _mm_alignr_epi8(row01, row00, 8);
          s[3] = _mm_alignr_epi8(row01, row00, 12);
          s[4] = _mm_alignr_epi8(row02, row01, 0);
          s[5] = _mm_alignr_epi8(row02, row01, 4);

          __m128i res_even = convolve_12tap(s, coeffs_x);
          res_even = _mm_sra_epi32(_mm_add_epi32(res_even, round_const_x),
                                   round_shift_x);
          res_even = _mm_sra_epi32(_mm_add_epi32(res_even, round_const_bits),
                                   round_shift_bits);

          // odd pixels
          s[0] = _mm_alignr_epi8(row01, row00, 2);
          s[1] = _mm_alignr_epi8(row01, row00, 6);
          s[2] = _mm_alignr_epi8(row01, row00, 10);
          s[3] = _mm_alignr_epi8(row01, row00, 14);
          s[4] = _mm_alignr_epi8(row02, row01, 2);
          s[5] = _mm_alignr_epi8(row02, row01, 6);

          __m128i res_odd = convolve_12tap(s, coeffs_x);
          res_odd = _mm_sra_epi32(_mm_add_epi32(res_odd, round_const_x),
                                  round_shift_x);
          res_odd = _mm_sra_epi32(_mm_add_epi32(res_odd, round_const_bits),
                                  round_shift_bits);

          __m128i res_even1 = _mm_packs_epi32(res_even, res_even);
          __m128i res_odd1 = _mm_packs_epi32(res_odd, res_odd);
          __m128i res = _mm_unpacklo_epi16(res_even1, res_odd1);

          res = _mm_min_epi16(res, clip_pixel);
          res = _mm_max_epi16(res, zero);

          if (w - j > 4) {
            _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j], res);
          } else if (w == 4) {
            _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j], res);
          } else {
            *((int *)(&dst[i * dst_stride + j])) = _mm_cvtsi128_si32(res);
          }
        }
      }
    }
  } else {
    __m128i s[4], coeffs_x[4];
    prepare_coeffs(filter_params_x, subpel_x_qn, coeffs_x);

    for (j = 0; j < w; j += 8) {
      /* Horizontal filter */
      {
        for (i = 0; i < h; i += 1) {
          const __m128i row00 =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
          const __m128i row01 =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + (j + 8)]);

          // even pixels
          s[0] = _mm_alignr_epi8(row01, row00, 0);
          s[1] = _mm_alignr_epi8(row01, row00, 4);
          s[2] = _mm_alignr_epi8(row01, row00, 8);
          s[3] = _mm_alignr_epi8(row01, row00, 12);

          __m128i res_even = convolve(s, coeffs_x);
          res_even = _mm_sra_epi32(_mm_add_epi32(res_even, round_const_x),
                                   round_shift_x);

          // odd pixels
          s[0] = _mm_alignr_epi8(row01, row00, 2);
          s[1] = _mm_alignr_epi8(row01, row00, 6);
          s[2] = _mm_alignr_epi8(row01, row00, 10);
          s[3] = _mm_alignr_epi8(row01, row00, 14);

          __m128i res_odd = convolve(s, coeffs_x);
          res_odd = _mm_sra_epi32(_mm_add_epi32(res_odd, round_const_x),
                                  round_shift_x);

          res_even = _mm_sra_epi32(_mm_add_epi32(res_even, round_const_bits),
                                   round_shift_bits);
          res_odd = _mm_sra_epi32(_mm_add_epi32(res_odd, round_const_bits),
                                  round_shift_bits);

          __m128i res_even1 = _mm_packs_epi32(res_even, res_even);
          __m128i res_odd1 = _mm_packs_epi32(res_odd, res_odd);
          __m128i res = _mm_unpacklo_epi16(res_even1, res_odd1);

          res = _mm_min_epi16(res, clip_pixel);
          res = _mm_max_epi16(res, zero);

          if (w - j > 4) {
            _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j], res);
          } else if (w == 4) {
            _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j], res);
          } else {
            *((int *)(&dst[i * dst_stride + j])) = _mm_cvtsi128_si32(res);
          }
        }
      }
    }
  }
}